

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void qt_bitmapblit_template<unsigned_int>
               (QRasterBuffer *rasterBuffer,int x,int y,uint color,uchar *map,int mapWidth,
               int mapHeight,int mapStride)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uchar uVar6;
  uchar *puVar7;
  int iVar8;
  uchar *local_60;
  
  puVar7 = rasterBuffer->m_buffer + (long)x * 4 + (long)y * rasterBuffer->bytes_per_line;
  lVar2 = (long)(int)((ulong)rasterBuffer->bytes_per_line >> 2);
  local_60 = map;
  if (mapWidth < 9) {
    while (0 < mapHeight) {
      mapHeight = mapHeight + -1;
      uVar6 = *local_60;
      iVar8 = 0;
      iVar4 = 0;
      while( true ) {
        if (uVar6 == '\0') break;
        if ((char)uVar6 < '\0') {
          iVar4 = iVar4 + 1;
        }
        else {
          if (iVar4 != 0) {
            (*qt_memfill32)((quint32 *)(puVar7 + (long)iVar8 * 4),color,(long)iVar4);
            iVar8 = iVar8 + iVar4;
          }
          iVar8 = iVar8 + 1;
          iVar4 = 0;
        }
        uVar6 = uVar6 * '\x02';
      }
      if (iVar4 != 0) {
        (*qt_memfill32)((quint32 *)(puVar7 + (long)iVar8 * 4),color,(long)iVar4);
      }
      puVar7 = puVar7 + lVar2 * 4;
      local_60 = local_60 + mapStride;
    }
  }
  else {
    while (0 < mapHeight) {
      mapHeight = mapHeight + -1;
      iVar8 = 0;
      iVar4 = 0;
      for (uVar3 = 0; uVar3 < (uint)mapWidth; uVar3 = uVar3 + 8) {
        uVar6 = local_60[uVar3 >> 3];
        for (iVar5 = -8; iVar5 != 0; iVar5 = iVar5 + 1) {
          if ((char)uVar6 < '\0') {
            iVar4 = iVar4 + 1;
          }
          else {
            iVar1 = 1;
            if (iVar4 != 0) {
              (*qt_memfill32)((quint32 *)(puVar7 + (long)iVar8 * 4),color,(long)iVar4);
              iVar1 = iVar4 + 1;
            }
            if (uVar6 == '\0') {
              iVar8 = (iVar4 + iVar8) - iVar5;
              iVar4 = 0;
              break;
            }
            iVar8 = iVar8 + iVar1;
            iVar4 = 0;
          }
          uVar6 = uVar6 * '\x02';
        }
      }
      if (iVar4 != 0) {
        (*qt_memfill32)((quint32 *)(puVar7 + (long)iVar8 * 4),color,(long)iVar4);
      }
      puVar7 = puVar7 + lVar2 * 4;
      local_60 = local_60 + mapStride;
    }
  }
  return;
}

Assistant:

static
inline void qt_bitmapblit_template(QRasterBuffer *rasterBuffer,
                                   int x, int y, DST color,
                                   const uchar *map,
                                   int mapWidth, int mapHeight, int mapStride)
{
    DST *dest = reinterpret_cast<DST *>(rasterBuffer->scanLine(y)) + x;
    const int destStride = rasterBuffer->stride<DST>();

    if (mapWidth > 8) {
        while (--mapHeight >= 0) {
            int x0 = 0;
            int n = 0;
            for (int x = 0; x < mapWidth; x += 8) {
                uchar s = map[x >> 3];
                for (int i = 0; i < 8; ++i) {
                    if (s & 0x80) {
                        ++n;
                    } else {
                        if (n) {
                            qt_memfill(dest + x0, color, n);
                            x0 += n + 1;
                            n = 0;
                        } else {
                            ++x0;
                        }
                        if (!s) {
                            x0 += 8 - 1 - i;
                            break;
                        }
                    }
                    s <<= 1;
                }
            }
            if (n)
                qt_memfill(dest + x0, color, n);
            dest += destStride;
            map += mapStride;
        }
    } else {
        while (--mapHeight >= 0) {
            int x0 = 0;
            int n = 0;
            for (uchar s = *map; s; s <<= 1) {
                if (s & 0x80) {
                    ++n;
                } else if (n) {
                    qt_memfill(dest + x0, color, n);
                    x0 += n + 1;
                    n = 0;
                } else {
                    ++x0;
                }
            }
            if (n)
                qt_memfill(dest + x0, color, n);
            dest += destStride;
            map += mapStride;
        }
    }
}